

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O2

bool_t priNextPrime(word *p,word *a,size_t n,size_t trials,size_t base_count,size_t iter,void *stack
                   )

{
  bool bVar1;
  bool_t bVar2;
  size_t sVar3;
  word wVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  size_t count;
  ulong uVar8;
  bool bVar9;
  
  sVar3 = wwBitSize(a,n);
  if (sVar3 < 2) {
LAB_0012efb1:
    bVar2 = 0;
  }
  else {
    wwCopy(p,a,n);
    uVar8 = *p;
    *p = uVar8 | 1;
    count = base_count;
    if (base_count != 0 && n == 1) {
      do {
        if (*(ulong *)(&DAT_0013c8b8 + count * 8) < (uVar8 | 1)) goto LAB_0012f017;
        count = count - 1;
      } while (count != 0);
      count = 0;
    }
LAB_0012f017:
    priBaseMod((word *)stack,p,n,count);
    sVar7 = 0;
    do {
      if (count == sVar7) {
        bVar1 = true;
        goto LAB_0012f059;
      }
      lVar6 = sVar7 * 8;
      sVar7 = sVar7 + 1;
    } while (*(long *)((long)stack + lVar6) != 0);
    bVar1 = false;
LAB_0012f059:
    while( true ) {
      sVar7 = 0xffffffffffffffff;
      if ((trials != 0xffffffffffffffff) && (sVar7 = trials - 1, trials == 0)) goto LAB_0012efb1;
      if ((bVar1) &&
         (bVar2 = priRMTest(p,n,iter,(void *)(base_count * 8 + (long)stack)), bVar2 != 0)) break;
      wVar4 = zzAddW2(p,n,2);
      if (wVar4 != 0) {
        return 0;
      }
      sVar5 = wwBitSize(p,n);
      if (sVar3 < sVar5) {
        return 0;
      }
      lVar6 = 0;
      bVar1 = true;
      sVar5 = count;
      while (bVar9 = sVar5 != 0, sVar5 = sVar5 - 1, trials = sVar7, bVar9) {
        uVar8 = *(ulong *)((long)stack + lVar6);
        if (uVar8 < *(long *)((long)_base + lVar6) - 2U) {
          uVar8 = uVar8 + 2;
        }
        else {
          bVar9 = uVar8 == *(long *)((long)_base + lVar6) - 1U;
          uVar8 = (ulong)bVar9;
          if (!bVar9) {
            bVar1 = false;
          }
        }
        *(ulong *)((long)stack + lVar6) = uVar8;
        lVar6 = lVar6 + 8;
      }
    }
    bVar2 = 1;
  }
  return bVar2;
}

Assistant:

bool_t priNextPrime(word p[], const word a[], size_t n, size_t trials,
	size_t base_count, size_t iter, void* stack)
{
	size_t l;
	size_t i;
	bool_t base_success;
	// переменные в stack
	word* mods;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, p, n));
	ASSERT(base_count <= priBaseSize());
	// раскладка stack
	mods = (word*)stack;
	stack = mods + base_count;
	// l <- битовая длина a
	l = wwBitSize(a, n);
	// 0-битовых и 1-битовых простых не существует
	if (l <= 1)
		return FALSE;
	// p <- минимальное нечетное >= a
	wwCopy(p, a, n);
	p[0] |= 1;
	// малое p?
	if (n == 1)
		// при необходимости скорректировать факторную базу
		while (base_count > 0 && priBasePrime(base_count - 1) >= p[0])
			--base_count;
	// рассчитать остатки от деления на малые простые
	priBaseMod(mods, p, n, base_count);
	for (i = 0, base_success = TRUE; i < base_count; ++i)
		if (mods[i] == 0)
		{
			base_success = FALSE;
			break;
		}
	// попытки
	while (trials == SIZE_MAX || trials--)
	{
		// проверка простоты
		if (base_success && priRMTest(p, n, iter, stack))
			return TRUE;
		// к следующему кандидату
		if (zzAddW2(p, n, 2) || wwBitSize(p, n) > l)
			return FALSE;
		for (i = 0, base_success = TRUE; i < base_count; ++i)
		{
			if (mods[i] < _base[i] - 2)
				mods[i] += 2;
			else if (mods[i] == _base[i] - 1)
				mods[i] = 1;
			else
				mods[i] = 0, base_success = FALSE;
		}
	}
	return FALSE;
}